

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O3

void * __thiscall
BitSetImplement<std::bitset<16000UL>,_KDefectiveRDS>::setUnion
          (BitSetImplement<std::bitset<16000UL>,_KDefectiveRDS> *this,void *A,void *B)

{
  ulong *puVar1;
  ulong uVar2;
  void *__dest;
  long lVar3;
  bitset<16000UL> __result;
  ulong local_7e8 [250];
  
  __dest = operator_new(2000);
  memcpy(local_7e8,A,2000);
  lVar3 = 0;
  do {
    puVar1 = (ulong *)((long)B + lVar3 * 8);
    uVar2 = puVar1[1];
    local_7e8[lVar3] = local_7e8[lVar3] | *puVar1;
    local_7e8[lVar3 + 1] = local_7e8[lVar3 + 1] | uVar2;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0xfa);
  memcpy(__dest,local_7e8,2000);
  return __dest;
}

Assistant:

void* BitSetImplement<Bitset, Base>::setUnion(void *A, void *B) {
	Bitset *__A__ = (Bitset*) A, *__B__ = (Bitset*) B, *__C__ = new Bitset();
	*__C__ = (*__A__) | (*__B__);
	return __C__;
}